

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O2

void CheckColorContrast(TidyDocImpl *doc,Node *node)

{
  TidyAttrId TVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Bool BVar7;
  Bool BVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  AttVal *av;
  int iVar15;
  uint code;
  AttVal *av_00;
  int rgbFG [3];
  int rgbBG [3];
  int brightBG;
  
  rgbBG[0] = 0xff;
  rgbBG[1] = 0xff;
  rgbBG[2] = 0xff;
  if ((doc->access).PRIORITYCHK == 3) {
    av_00 = (AttVal *)&node->attributes;
    BVar8 = yes;
    av = av_00;
    while (iVar6 = rgbBG[2], av = av->next, av != (AttVal *)0x0) {
      if (((av->dict != (Attribute *)0x0) && (av->dict->id == TidyAttr_BGCOLOR)) &&
         (BVar7 = hasValue(av), BVar7 != no)) {
        BVar8 = GetRgb(av->value,rgbBG);
      }
    }
    iVar4 = rgbBG[0];
    iVar5 = rgbBG[1];
    iVar9 = rgbBG[0] * 299;
    iVar12 = rgbBG[1] * 0x24b;
    iVar10 = rgbBG[2] * 0x72;
    if (BVar8 != no) {
      while( true ) {
        do {
          av_00 = av_00->next;
          if (av_00 == (AttVal *)0x0) {
            return;
          }
        } while (av_00->dict == (Attribute *)0x0);
        TVar1 = av_00->dict->id;
        if (TVar1 == TidyAttr_ALINK) break;
        if (TVar1 == TidyAttr_VLINK) {
          code = 0x2b5;
          goto LAB_0014e8ee;
        }
        if (TVar1 == TidyAttr_TEXT) {
          code = 0x2b2;
          goto LAB_0014e8ee;
        }
        if (TVar1 == TidyAttr_LINK) {
          code = 0x2b3;
LAB_0014e8ee:
          BVar8 = hasValue(av_00);
          if (BVar8 != no) {
            rgbFG[2] = 0;
            rgbFG[0] = 0;
            rgbFG[1] = 0;
            BVar8 = GetRgb(av_00->value,rgbFG);
            if (BVar8 != no) {
              uVar11 = (rgbFG[2] * 0x72 + rgbFG[1] * 0x24b + rgbFG[0] * 299) / -1000 +
                       (iVar10 + iVar12 + iVar9) / 1000;
              uVar2 = -uVar11;
              if (0 < (int)uVar11) {
                uVar2 = uVar11;
              }
              iVar13 = iVar4 - rgbFG[0];
              iVar3 = -iVar13;
              if (0 < iVar13) {
                iVar3 = iVar13;
              }
              iVar14 = iVar5 - rgbFG[1];
              iVar13 = -iVar14;
              if (0 < iVar14) {
                iVar13 = iVar14;
              }
              iVar15 = iVar6 - rgbFG[2];
              iVar14 = -iVar15;
              if (0 < iVar15) {
                iVar14 = iVar15;
              }
              if ((uVar2 < 0xb5) || ((uint)(iVar13 + iVar3 + iVar14) < 0x1f5)) {
                prvTidyReportAccessError(doc,node,code);
              }
            }
          }
        }
      }
      code = 0x2b4;
      goto LAB_0014e8ee;
    }
  }
  return;
}

Assistant:

static void CheckColorContrast( TidyDocImpl* doc, Node* node )
{
    int rgbBG[3] = {255,255,255};   /* Black text on white BG */

    if (Level3_Enabled( doc ))
    {
        Bool gotBG = yes;
        AttVal* av;

        /* Check for 'BGCOLOR' first to compare with other color attributes */
        for ( av = node->attributes; av; av = av->next )
        {            
            if ( attrIsBGCOLOR(av) )
            {
                if ( hasValue(av) )
                    gotBG = GetRgb( av->value, rgbBG );
            }
        }
        
        /* 
           Search for COLOR attributes to compare with background color
           Must have valid colour contrast
        */
        for ( av = node->attributes; gotBG && av != NULL; av = av->next )
        {
            uint errcode = 0;
            if ( attrIsTEXT(av) )
                errcode = COLOR_CONTRAST_TEXT;
            else if ( attrIsLINK(av) )
                errcode = COLOR_CONTRAST_LINK;
            else if ( attrIsALINK(av) )
                errcode = COLOR_CONTRAST_ACTIVE_LINK;
            else if ( attrIsVLINK(av) )
                errcode = COLOR_CONTRAST_VISITED_LINK;

            if ( errcode && hasValue(av) )
            {
                int rgbFG[3] = {0, 0, 0};  /* Black text */

                if ( GetRgb(av->value, rgbFG) &&
                     !CompareColors(rgbBG, rgbFG) )
                {
                    TY_(ReportAccessError)( doc, node, errcode );
                }
            }
        }
    }
}